

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

factor * __thiscall
merlin::factor::binaryOp<merlin::factor::binOpTimes>
          (factor *__return_storage_ptr__,factor *this,long B)

{
  pointer pdVar1;
  size_t i;
  ulong uVar2;
  variable_set v;
  subindex s1;
  subindex s2;
  variable_set vStack_e8;
  subindex local_b0;
  subindex local_70;
  
  variable_set::operator+(&vStack_e8,&this->v_,(variable_set *)(B + 8));
  factor(__return_storage_ptr__,&vStack_e8,1.0);
  subindex::subindex(&local_b0,&vStack_e8,&this->v_);
  subindex::subindex(&local_70,&vStack_e8,(variable_set *)(B + 8));
  for (uVar2 = 0;
      pdVar1 = (__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(__return_storage_ptr__->t_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar2 = uVar2 + 1) {
    pdVar1[uVar2] =
         (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[local_b0.m_idx] *
         *(double *)(*(long *)(B + 0x40) + local_70.m_idx * 8);
    subindex::operator++(&local_b0);
    subindex::operator++(&local_70);
  }
  subindex::~subindex(&local_70);
  subindex::~subindex(&local_b0);
  variable_set::~variable_set(&vStack_e8);
  return __return_storage_ptr__;
}

Assistant:

factor binaryOp(const factor& B,
			Function Op) const {
		variable_set v = v_ + B.v_;  						// expand scope to union
		factor F(v);             					//  and create target factor
		subindex s1(v, v_), s2(v, B.v_); 	// index over A and B & do the op
		for (size_t i = 0; i < F.num_states(); ++i, ++s1, ++s2)
			F[i] = Op(t_[s1], B[s2]);
		return F; 										// return the new copy
	}